

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_of_responsibility1.cpp
# Opt level: O3

int main(void)

{
  HelpHandler *this;
  Widget *h;
  Button *this_00;
  
  this = (HelpHandler *)operator_new(0x18);
  HelpHandler::HelpHandler(this,(HelpHandler *)0x0,3);
  this->_vptr_HelpHandler = (_func_int **)&PTR_HasHelp_00104d78;
  h = (Widget *)operator_new(0x20);
  Dialog::Dialog((Dialog *)h,this,1);
  this_00 = (Button *)operator_new(0x20);
  Button::Button(this_00,h,2);
  (*(this_00->super_Widget).super_HelpHandler._vptr_HelpHandler[2])(this_00);
  return 0;
}

Assistant:

int main()
{
    const Topic PRINT_TOPIC = 1;
    const Topic PAPER_ORIENTATION_TOPIC = 2;
    const Topic APPLICATION_TOPIC = 3;

    Application* application = new Application(APPLICATION_TOPIC);
    Dialog* dialog = new Dialog(application, PRINT_TOPIC);
    Button* button = new Button(dialog, PAPER_ORIENTATION_TOPIC);

    button->HandleHelp();
}